

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

void sysvsum(uint *sum,void *buf,size_t size)

{
  byte *local_30;
  uchar *cp;
  size_t sStack_20;
  uint thisrun;
  size_t size_local;
  void *buf_local;
  uint *sum_local;
  
  cp._4_4_ = *sum;
  local_30 = (byte *)buf;
  sStack_20 = size;
  while (sStack_20 != 0) {
    cp._4_4_ = *local_30 + cp._4_4_;
    local_30 = local_30 + 1;
    sStack_20 = sStack_20 - 1;
  }
  *sum = cp._4_4_;
  return;
}

Assistant:

static void
sysvsum(unsigned int * sum, void * buf, size_t size)
{
    unsigned int thisrun = *sum;
    unsigned char * cp = buf;
    while(size --)    
        thisrun += *(cp++);
    *sum = thisrun;
}